

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O1

int main(int argc,char **argv)

{
  sunrealtype (*pasVar1) [6];
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  WebData wdata;
  sunrealtype **ppsVar7;
  N_Vector p_Var8;
  int *piVar9;
  WebData c;
  sunrealtype (*pasVar10) [6];
  WebData wdata_00;
  int mxns;
  WebData wdata_01;
  char *pcVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int iVar19;
  undefined1 auVar18 [16];
  int iVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  int iVar27;
  undefined1 auVar28 [16];
  void *cvode_mem;
  int indexB;
  int ncheck;
  sunrealtype t;
  void *local_48;
  int local_40;
  uint local_3c;
  undefined1 local_38 [8];
  
  local_48 = (void *)0x0;
  uVar6 = SUNContext_Create(0,&sunctx);
  if ((int)uVar6 < 0) {
    pcVar11 = "SUNContext_Create";
  }
  else {
    wdata = (WebData)malloc(0x9948);
    lVar17 = 4;
    do {
      ppsVar7 = (sunrealtype **)SUNDlsMat_newDenseMat(6,6);
      wdata->P[lVar17 + -4] = ppsVar7;
      ppsVar7 = (sunrealtype **)SUNDlsMat_newIndexArray(6);
      wdata->P[lVar17] = ppsVar7;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    p_Var8 = (N_Vector)N_VNew_Serial(0x960,sunctx);
    wdata->rewt = p_Var8;
    p_Var8 = (N_Vector)N_VNew_Serial(0x960);
    wdata->vtemp = p_Var8;
    if (wdata == (WebData)0x0) {
      main_cold_6();
      return 1;
    }
    pasVar1 = wdata->acoef;
    wdata->ns = 6;
    lVar17 = 0;
    pasVar10 = pasVar1;
    do {
      lVar13 = 0;
      do {
        *(undefined8 *)((long)*pasVar10 + lVar13) = 0;
        lVar13 = lVar13 + 0x30;
      } while (lVar13 != 0x120);
      lVar17 = lVar17 + 1;
      pasVar10 = (sunrealtype (*) [6])(*pasVar10 + 1);
    } while (lVar17 != 6);
    pasVar10 = wdata->acoef + 3;
    lVar17 = 0;
    do {
      lVar13 = -0x90;
      do {
        *(undefined8 *)((long)(pasVar10 + 3) + lVar13) = 0x40c3880000000000;
        *(undefined8 *)((long)*pasVar10 + lVar13 + 0x18) = 0xbea0c6f7a0b5ed8d;
        lVar13 = lVar13 + 0x30;
      } while (lVar13 != 0);
      *(undefined8 *)(lVar17 * 0x38 + (long)pasVar1) = 0xbff0000000000000;
      *(undefined8 *)((lVar17 + 3) * 0x38 + (long)pasVar1) = 0xbff0000000000000;
      wdata->bcoef[lVar17] = 1.0;
      wdata->bcoef[lVar17 + 3] = -1.0;
      wdata->diff[lVar17] = 1.0;
      wdata->diff[lVar17 + 3] = 0.5;
      lVar17 = lVar17 + 1;
      pasVar10 = (sunrealtype (*) [6])(*pasVar10 + 1);
    } while (lVar17 != 3);
    wdata->mxns = 0x78;
    wdata->dx = 0.05263157894736842;
    wdata->dy = 0.05263157894736842;
    auVar28 = _DAT_00105020;
    lVar17 = 0x50;
    do {
      auVar18 = divpd(*(undefined1 (*) [16])(wdata->P + lVar17),auVar28);
      *(undefined1 (*) [16])(wdata->pivot + lVar17 + 2) = auVar18;
      *(undefined1 (*) [16])(wdata->pivot + lVar17 + 8) = auVar18;
      lVar17 = lVar17 + 2;
    } while (lVar17 != 0x56);
    wdata->mp = 6;
    wdata->mq = 400;
    wdata->mx = 0x14;
    wdata->my = 0x14;
    wdata->srur = 1.4901161193847656e-08;
    wdata->ngrp = 4;
    wdata->ngx = 2;
    wdata->ngy = 2;
    wdata->mxmp = 0x78;
    piVar9 = wdata->jgx;
    lVar17 = 0;
    do {
      *piVar9 = (int)lVar17;
      lVar17 = lVar17 + 10;
      piVar9 = piVar9 + 1;
    } while (lVar17 == 10);
    wdata->jgx[2] = 0x14;
    wdata->jigx[0] = 0;
    wdata->jigx[1] = 0;
    wdata->jigx[2] = 0;
    wdata->jigx[3] = 0;
    wdata->jigx[4] = 0;
    wdata->jigx[5] = 0;
    wdata->jigx[6] = 0;
    wdata->jigx[7] = 0;
    wdata->jigx[8] = 0;
    auVar20 = _DAT_00105070;
    auVar18 = _DAT_00105060;
    auVar28 = _DAT_00105050;
    wdata->jigx[9] = 0;
    lVar17 = 0;
    iVar12 = (int)DAT_00105080;
    iVar19 = DAT_00105080._4_4_;
    do {
      auVar22._8_4_ = (int)lVar17;
      auVar22._0_8_ = lVar17;
      auVar22._12_4_ = (int)((ulong)lVar17 >> 0x20);
      auVar23 = (auVar22 | auVar18) ^ auVar20;
      if (auVar23._4_4_ == iVar19 && auVar23._0_4_ < iVar12) {
        wdata->jigx[lVar17 + 10] = 1;
        wdata->jigx[lVar17 + 0xb] = 1;
      }
      auVar22 = (auVar22 | auVar28) ^ auVar20;
      if (auVar22._4_4_ == iVar19 && auVar22._0_4_ < iVar12) {
        wdata->jigx[lVar17 + 0xc] = 1;
        wdata->jigx[lVar17 + 0xd] = 1;
      }
      lVar17 = lVar17 + 4;
    } while (lVar17 != 0xc);
    wdata->jxr[0] = 4;
    wdata->jxr[1] = 0xe;
    piVar9 = wdata->jgy;
    lVar17 = 0;
    do {
      *piVar9 = (int)lVar17;
      lVar17 = lVar17 + 10;
      piVar9 = piVar9 + 1;
    } while (lVar17 == 10);
    wdata->jgy[2] = 0x14;
    wdata->jigy[0] = 0;
    wdata->jigy[1] = 0;
    wdata->jigy[2] = 0;
    wdata->jigy[3] = 0;
    wdata->jigy[4] = 0;
    wdata->jigy[5] = 0;
    wdata->jigy[6] = 0;
    wdata->jigy[7] = 0;
    wdata->jigy[8] = 0;
    wdata->jigy[9] = 0;
    lVar17 = 0;
    do {
      auVar23._8_4_ = (int)lVar17;
      auVar23._0_8_ = lVar17;
      auVar23._12_4_ = (int)((ulong)lVar17 >> 0x20);
      auVar22 = (auVar23 | auVar18) ^ auVar20;
      if (auVar22._4_4_ == iVar19 && auVar22._0_4_ < iVar12) {
        wdata->jigy[lVar17 + 10] = 1;
        wdata->jigy[lVar17 + 0xb] = 1;
      }
      auVar22 = (auVar23 | auVar28) ^ auVar20;
      if (auVar22._4_4_ == iVar19 && auVar22._0_4_ < iVar12) {
        wdata->jigy[lVar17 + 0xc] = 1;
        wdata->jigy[lVar17 + 0xd] = 1;
      }
      lVar17 = lVar17 + 4;
    } while (lVar17 != 0xc);
    wdata->jyr[0] = 4;
    wdata->jyr[1] = 0xe;
    p_Var8 = (N_Vector)N_VNew_Serial(0x960,sunctx);
    if (p_Var8 == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    lVar17 = N_VGetArrayPointer(p_Var8);
    auVar18 = _DAT_00105070;
    auVar28 = _DAT_00105060;
    iVar12 = wdata->ns;
    iVar19 = wdata->mxns;
    dVar2 = wdata->dx;
    dVar3 = wdata->dy;
    lVar13 = (ulong)(iVar12 + 1U) - 2;
    auVar20._8_4_ = (int)lVar13;
    auVar20._0_8_ = lVar13;
    auVar20._12_4_ = (int)((ulong)lVar13 >> 0x20);
    lVar17 = lVar17 + 8;
    lVar13 = 0;
    auVar20 = auVar20 ^ _DAT_00105070;
    do {
      dVar24 = (double)(int)lVar13 * dVar3;
      dVar24 = dVar24 * 4.0 * (1.0 - dVar24);
      dVar24 = dVar24 * dVar24;
      lVar15 = 0;
      lVar14 = lVar17;
      do {
        dVar25 = (double)(int)lVar15 * dVar2;
        if (0 < iVar12) {
          dVar25 = dVar25 * 4.0 * (1.0 - dVar25);
          dVar25 = dVar25 * dVar25;
          uVar16 = 0;
          do {
            iVar5 = (int)uVar16;
            auVar26._8_4_ = iVar5;
            auVar26._0_8_ = uVar16;
            auVar26._12_4_ = (int)(uVar16 >> 0x20);
            auVar22 = (auVar26 | auVar28) ^ auVar18;
            bVar4 = auVar20._0_4_ < auVar22._0_4_;
            iVar21 = auVar20._4_4_;
            iVar27 = auVar22._4_4_;
            if ((bool)(~(iVar21 < iVar27 || iVar27 == iVar21 && bVar4) & 1)) {
              *(double *)(lVar14 + -8 + uVar16 * 8) = (double)(iVar5 + 1) * dVar25 * dVar24 + 10.0;
            }
            if (iVar21 >= iVar27 && (iVar27 != iVar21 || !bVar4)) {
              *(double *)(lVar14 + uVar16 * 8) = (double)(iVar5 + 2) * dVar25 * dVar24 + 10.0;
            }
            uVar16 = uVar16 + 2;
          } while ((iVar12 + 1U & 0xfffffffe) != uVar16);
        }
        lVar15 = lVar15 + 1;
        lVar14 = lVar14 + (long)iVar12 * 8;
      } while (lVar15 != 0x14);
      lVar13 = lVar13 + 1;
      lVar17 = lVar17 + (long)iVar19 * 8;
    } while (lVar13 != 0x14);
    puts("\nCreate and allocate CVODES memory for forward run");
    local_48 = (void *)CVodeCreate(2,sunctx);
    if (local_48 == (void *)0x0) {
      main_cold_4();
      return 1;
    }
    wdata->cvode_mem = local_48;
    uVar6 = CVodeSetUserData(local_48,wdata);
    if ((int)uVar6 < 0) {
      pcVar11 = "CVodeSetUserData";
    }
    else {
      uVar6 = CVodeInit(0,local_48,f,p_Var8);
      if ((int)uVar6 < 0) {
        pcVar11 = "CVodeInit";
      }
      else {
        uVar6 = CVodeSStolerances(0x3ee4f8b588e368f1,0x3ee4f8b588e368f1,local_48);
        if ((int)uVar6 < 0) {
          pcVar11 = "CVodeSStolerances";
        }
        else {
          lVar17 = SUNLinSol_SPGMR(p_Var8,1,0,sunctx);
          if (lVar17 == 0) {
            main_cold_3();
            return 1;
          }
          uVar6 = CVodeSetLinearSolver(local_48,lVar17,0);
          if ((int)uVar6 < 0) {
            pcVar11 = "CVodeSetLinearSolver";
          }
          else {
            uVar6 = CVodeSetPreconditioner(local_48,Precond,PSolve);
            if ((int)uVar6 < 0) {
              pcVar11 = "CVodeSetPreconditioner";
            }
            else {
              uVar6 = CVodeSetMaxNumSteps(local_48,0x9c4);
              if (-1 < (int)uVar6) {
                puts("\nAllocate global memory");
                uVar6 = CVodeAdjInit(local_48,0x50,1);
                if ((int)uVar6 < 0) {
                  pcVar11 = "CVodeAdjInit";
                }
                else {
                  puts("\nForward integration");
                  uVar6 = CVodeF(0x4024000000000000,local_48,p_Var8,local_38,1,&local_3c);
                  if ((int)uVar6 < 0) {
                    pcVar11 = "CVodeF";
                  }
                  else {
                    printf("\nncheck = %d\n",(ulong)local_3c);
                    iVar12 = (int)wdata;
                    doubleIntgr(p_Var8,iVar12,wdata_01);
                    printf("\n   g = int_x int_y c%d(Tfinal,x,y) dx dy = %f \n\n",6);
                    auVar28 = N_VNew_Serial(0x960,sunctx);
                    c = auVar28._0_8_;
                    if (c == (WebData)0x0) {
                      main_cold_2();
                      return 1;
                    }
                    CbInit((N_Vector)c,iVar12,auVar28._8_8_);
                    puts("\nCreate and allocate CVODES memory for backward run");
                    uVar6 = CVodeCreateB(local_48,2,&local_40);
                    if ((int)uVar6 < 0) {
                      pcVar11 = "CVodeCreateB";
                    }
                    else {
                      uVar6 = CVodeSetUserDataB(local_48,local_40,wdata);
                      if ((int)uVar6 < 0) {
                        pcVar11 = "CVodeSetUserDataB";
                      }
                      else {
                        uVar6 = CVodeInitB(0x4024000000000000,local_48,local_40,fB,c);
                        if ((int)uVar6 < 0) {
                          pcVar11 = "CVodeInitB";
                        }
                        else {
                          uVar6 = CVodeSStolerancesB(0x3ee4f8b588e368f1,0x3ee4f8b588e368f1,local_48,
                                                     local_40);
                          if (-1 < (int)uVar6) {
                            wdata->indexB = local_40;
                            lVar13 = SUNLinSol_SPGMR(c,1,0,sunctx);
                            if (lVar13 == 0) {
                              main_cold_1();
                              return 1;
                            }
                            uVar6 = CVodeSetLinearSolverB(local_48,local_40,lVar13,0);
                            if ((int)uVar6 < 0) {
                              pcVar11 = "CVodeSetLinearSolverB";
                            }
                            else {
                              uVar6 = CVodeSetPreconditionerB(local_48,local_40,PrecondB,PSolveB);
                              if (-1 < (int)uVar6) {
                                puts("\nBackward integration");
                                uVar6 = CVodeB(0,local_48,1);
                                if ((int)uVar6 < 0) {
                                  pcVar11 = "CVodeB";
                                }
                                else {
                                  wdata_00 = c;
                                  uVar6 = CVodeGetB(local_48,local_40,local_38);
                                  if (-1 < (int)uVar6) {
                                    PrintOutput((N_Vector)c,iVar12,mxns,wdata_00);
                                    CVodeFree(&local_48);
                                    N_VDestroy(p_Var8);
                                    N_VDestroy(c);
                                    SUNLinSolFree(lVar17);
                                    SUNLinSolFree(lVar13);
                                    SUNContext_Free(&sunctx);
                                    FreeUserData(wdata);
                                    return 0;
                                  }
                                  pcVar11 = "CVodeGetB";
                                }
                                goto LAB_00102fff;
                              }
                              pcVar11 = "CVodeSetPreconditionerB";
                            }
                            goto LAB_00102fbd;
                          }
                          pcVar11 = "CVodeSStolerancesB";
                        }
                      }
                    }
                  }
                }
LAB_00102fff:
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar11,
                        (ulong)uVar6);
                return 1;
              }
              pcVar11 = "CVodeSetMaxNumSteps";
            }
          }
        }
      }
    }
  }
LAB_00102fbd:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar11,(ulong)uVar6);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  sunrealtype abstol = ATOL, reltol = RTOL, t;
  N_Vector c;
  WebData wdata;
  void* cvode_mem;
  SUNLinearSolver LS, LSB;

  int retval, ncheck;

  int indexB;

  sunrealtype reltolB = RTOL, abstolB = ATOL;
  N_Vector cB;

  c         = NULL;
  cB        = NULL;
  wdata     = NULL;
  cvode_mem = NULL;
  LS = LSB = NULL;

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate and initialize user data */

  wdata = AllocUserData();
  if (check_retval((void*)wdata, "AllocUserData", 2)) { return (1); }
  InitUserData(wdata);

  /* Set-up forward problem */

  /* Initializations */
  c = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)c, "N_VNew_Serial", 0)) { return (1); }
  CInit(c, wdata);

  /* Call CVodeCreate/CVodeInit for forward run */
  printf("\nCreate and allocate CVODES memory for forward run\n");
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }
  wdata->cvode_mem = cvode_mem; /* Used in Precond */
  retval           = CVodeSetUserData(cvode_mem, wdata);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }
  retval = CVodeInit(cvode_mem, f, T0, c);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create SUNLinSol_SPGMR linear solver for forward run */
  LS = SUNLinSol_SPGMR(c, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Attach the linear sovler */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
  if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

  /* Call CVodeSetMaxNumSteps to set the maximum number of steps the
   * solver will take in an attempt to reach the next output time
   * during forward integration. */
  retval = CVodeSetMaxNumSteps(cvode_mem, 2500);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Set-up adjoint calculations */

  printf("\nAllocate global memory\n");
  retval = CVodeAdjInit(cvode_mem, NSTEPS, CV_HERMITE);
  if (check_retval(&retval, "CVodeAdjInit", 1)) { return (1); }

  /* Perform forward run */

  printf("\nForward integration\n");
  retval = CVodeF(cvode_mem, TOUT, c, &t, CV_NORMAL, &ncheck);
  if (check_retval(&retval, "CVodeF", 1)) { return (1); }

  printf("\nncheck = %d\n", ncheck);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("\n   g = int_x int_y c%d(Tfinal,x,y) dx dy = %Lf \n\n", ISPEC,
         doubleIntgr(c, ISPEC, wdata));
#else
  printf("\n   g = int_x int_y c%d(Tfinal,x,y) dx dy = %f \n\n", ISPEC,
         doubleIntgr(c, ISPEC, wdata));
#endif

  /* Set-up backward problem */

  /* Allocate cB */
  cB = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)cB, "N_VNew_Serial", 0)) { return (1); }
  /* Initialize cB = 0 */
  CbInit(cB, ISPEC, wdata);

  /* Create and allocate CVODES memory for backward run */
  printf("\nCreate and allocate CVODES memory for backward run\n");
  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }
  retval = CVodeSetUserDataB(cvode_mem, indexB, wdata);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }
  retval = CVodeInitB(cvode_mem, indexB, fB, TOUT, cB);
  if (check_retval(&retval, "CVodeInitB", 1)) { return (1); }
  retval = CVodeSStolerancesB(cvode_mem, indexB, reltolB, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  wdata->indexB = indexB;

  /* Create SUNLinSol_SPGMR linear solver for backward run */
  LSB = SUNLinSol_SPGMR(cB, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LSB, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Attach the linear sovler */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB, LSB, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return 1; }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditionerB(cvode_mem, indexB, PrecondB, PSolveB);
  if (check_retval(&retval, "CVodeSetPreconditionerB", 1)) { return (1); }

  /* Perform backward integration */

  printf("\nBackward integration\n");
  retval = CVodeB(cvode_mem, T0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &t, cB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  PrintOutput(cB, NS, MXNS, wdata);

  /* Free all memory */
  CVodeFree(&cvode_mem);

  N_VDestroy(c);
  N_VDestroy(cB);
  SUNLinSolFree(LS);
  SUNLinSolFree(LSB);
  SUNContext_Free(&sunctx);
  FreeUserData(wdata);

  return (0);
}